

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int luaL_callmeta(lua_State *L,int obj,char *event)

{
  int obj_00;
  int iVar1;
  
  obj_00 = lua_absindex(L,obj);
  iVar1 = luaL_getmetafield(L,obj_00,event);
  if (iVar1 != 0) {
    lua_pushvalue(L,obj_00);
    lua_callk(L,1,1,0,(lua_KFunction)0x0);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

LUALIB_API int luaL_callmeta(lua_State *L, int obj, const char *event) {
    obj = lua_absindex(L, obj);
    if (luaL_getmetafield(L, obj, event) == LUA_TNIL)  /* no metafield? */
        return 0;
    lua_pushvalue(L, obj);
    lua_call(L, 1, 1);
    return 1;
}